

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O1

void __thiscall
b_tree::_insert_atomic_recursive(b_tree *this,int64_t key,int64_t value,int64_t node_ofs)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  b_tree_node node;
  b_tree_node child;
  b_tree_node bStack_f8;
  b_tree_node local_90;
  
  b_tree_node::b_tree_node(&bStack_f8,&this->_p,node_ofs);
  uVar3 = 0;
  printf("%ld ",bStack_f8._ofs_field);
  if (*bStack_f8._leaf_field == 0) {
    uVar1 = *bStack_f8._num_keys_field;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (key <= bStack_f8._keys_field[uVar3 & 0xffff]) goto LAB_00107d72;
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
      } while (uVar1 != uVar2);
      uVar3 = (ulong)(uint)uVar1;
    }
LAB_00107d72:
    b_tree_node::b_tree_node(&local_90,&this->_p,bStack_f8._child_ofs_field[uVar3 & 0xffff]);
    if ((uint)this->_min_degree * 2 - 1 == (uint)*local_90._num_keys_field) {
      puts("split child ofs");
      b_tree_node::_split_child(&bStack_f8,(int)uVar3,local_90._ofs_field);
      uVar3 = (ulong)((int)uVar3 + (uint)(bStack_f8._keys_field[uVar3 & 0xffff] < key));
    }
    _insert_atomic_recursive(this,key,value,bStack_f8._child_ofs_field[uVar3 & 0xffff]);
    r_memory_map::~r_memory_map(&local_90._mm);
  }
  else {
    b_tree_node::_insert_non_full(&bStack_f8,key,value);
  }
  r_memory_map::~r_memory_map(&bStack_f8._mm);
  return;
}

Assistant:

void b_tree::_insert_atomic_recursive(int64_t key, int64_t value, int64_t node_ofs)
{
    b_tree_node node(_p, node_ofs);
    printf("%ld ", node._ofs());

    // If the node is a leaf, insert the key-value pair
    if (node._leaf())
        node._insert_non_full(key, value);
    else
    {
        // If the node is an internal node, find the appropriate child to descend into
        int i = 0;
        while (i < node._num_keys() && key > node._key(i))
            i++;

        b_tree_node child(_p, node._child_ofs(i));
        if (child._num_keys() == 2 * _min_degree - 1) {
            // If the child node is full, split it before descending
            printf("split child ofs\n");
            node._split_child(i, child._ofs());
            if (key > node._key(i))
                i++;
        }

        // Recursively insert the key-value pair into the appropriate child
        _insert_atomic_recursive(key, value, node._child_ofs(i));
    }
}